

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O1

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::AsyncQueue
          (AsyncQueue<nrg::PrioExecution> *this,ExceptionHandler *onError)

{
  undefined8 uVar1;
  AsyncQueue<nrg::PrioExecution> *local_40;
  code *local_38;
  undefined8 local_30;
  
  *(undefined8 *)((long)&(this->guard_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->guard_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->guard_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->guard_).super___mutex_base._M_mutex + 8) = 0;
  (this->guard_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cond_);
  (this->queue_).c.
  super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->queue_).c.
  super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queue_).c.
  super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->running_ = true;
  *(undefined8 *)&(this->onError_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onError_).super__Function_base._M_functor + 8) = 0;
  (this->onError_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onError_)._M_invoker = onError->_M_invoker;
  if ((onError->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(onError->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->onError_).super__Function_base._M_functor =
         *(undefined8 *)&(onError->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->onError_).super__Function_base._M_functor + 8) = uVar1;
    (this->onError_).super__Function_base._M_manager = (onError->super__Function_base)._M_manager;
    (onError->super__Function_base)._M_manager = (_Manager_type)0x0;
    onError->_M_invoker = (_Invoker_type)0x0;
  }
  local_38 = run;
  local_30 = 0;
  local_40 = this;
  std::thread::
  thread<void(nrg::detail::AsyncQueue<nrg::PrioExecution>::*)(),nrg::detail::AsyncQueue<nrg::PrioExecution>*,void>
            (&this->thread_,(offset_in_AsyncQueue<nrg::PrioExecution>_to_subr *)&local_38,&local_40)
  ;
  return;
}

Assistant:

AsyncQueue(typename AsyncStyle::ExceptionHandler onError)
        : running_(true)
        , onError_(std::move(onError))
        , thread_(std::thread(&AsyncQueue::run, this))
    {}